

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedGroup::Clear(TestParsingMergeLite_RepeatedGroup *this)

{
  TestAllTypesLite *this_00;
  LogMessageFatal LStack_18;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) !=
      (undefined1  [16])0x0) {
    this_00 = (this->field_0)._impl_.repeated_group_all_types_;
    if (this_00 == (TestAllTypesLite *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&LStack_18,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest_lite.pb.cc"
                 ,0x20b6,"_impl_.repeated_group_all_types_ != nullptr");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
    }
    TestAllTypesLite::Clear(this_00);
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestParsingMergeLite_RepeatedGroup::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestParsingMergeLite.RepeatedGroup)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(_impl_.repeated_group_all_types_ != nullptr);
    _impl_.repeated_group_all_types_->Clear();
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}